

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc64.cpp
# Opt level: O1

void __thiscall Crc64::DisplayTable(Crc64 *this)

{
  long lVar1;
  long lVar2;
  undefined1 uVar3;
  int iVar4;
  ostream *poVar5;
  int iVar6;
  
  iVar4 = 0;
  do {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
      lVar2 = std::cout;
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) | 0x4000;
      lVar1 = *(long *)(lVar2 + -0x18);
      *(uint *)(std::ios_base::Init::Init + lVar1) =
           *(uint *)(std::ios_base::Init::Init + lVar1) & 0xffffffb5 | 8;
      lVar1 = *(long *)(lVar2 + -0x18);
      if (*(char *)(lVar1 + 0x10a181) == '\0') {
        uVar3 = std::ios::widen((char)lVar1 + -0x60);
        *(undefined1 *)(lVar1 + 0x10a180) = uVar3;
        *(undefined1 *)(lVar1 + 0x10a181) = 1;
      }
      *(undefined1 *)(lVar1 + 0x10a180) = 0x30;
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0x10;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x10);
  return;
}

Assistant:

void Crc64::DisplayTable() const
{
  int index = 0;

  for (int i = 0; i < 16; ++i)
  {
    for (int j = 0; j < 16; ++j)
    {
      std::cout << "0x" << std::uppercase << std::hex << std::setfill('0') << std::setw(16) << crcTable[index++] << ", ";
    }

    std::cout << "\n";
  }
}